

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O0

void __thiscall Strings::QuotedEncoding::writeHex(QuotedEncoding *this,char c)

{
  String local_28;
  char local_11;
  QuotedEncoding *pQStack_10;
  char c_local;
  QuotedEncoding *this_local;
  
  local_11 = c;
  pQStack_10 = this;
  if (this->lineLength < 0x49) {
    this->lineLength = this->lineLength + 3;
  }
  else {
    Bstrlib::String::operator+=(this->out,"=\r\n");
    this->lineLength = 3;
  }
  Bstrlib::String::Print((char *)&local_28,"=%2x",(ulong)(uint)(int)local_11);
  Bstrlib::String::operator+=(this->out,&local_28);
  Bstrlib::String::~String(&local_28);
  return;
}

Assistant:

void writeHex(const char c)
        {
            // Check for line cut
            if (lineLength >= 73) { out += "=\r\n"; lineLength = 3; }
	        else lineLength += 3;
	        out += FastString::Print("=%2x", c);
        }